

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall lzham::adaptive_bit_model::update(adaptive_bit_model *this,uint bit)

{
  uint bit_local;
  adaptive_bit_model *this_local;
  
  if (bit == 0) {
    this->m_bit_0_prob = this->m_bit_0_prob + (short)(0x800 - this->m_bit_0_prob >> 5);
  }
  else {
    this->m_bit_0_prob = this->m_bit_0_prob - (short)((int)(uint)this->m_bit_0_prob >> 5);
  }
  return;
}

Assistant:

void adaptive_bit_model::update(uint bit)
   {
      if (!bit)
         m_bit_0_prob += ((cSymbolCodecArithProbScale - m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);
      else
         m_bit_0_prob -= (m_bit_0_prob >> cSymbolCodecArithProbMoveBits);
      LZHAM_ASSERT(m_bit_0_prob >= 1);
      LZHAM_ASSERT(m_bit_0_prob < cSymbolCodecArithProbScale);
   }